

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_modes_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                   TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  RestorationInfo *pRVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  aom_cdf_prob aVar7;
  int iVar8;
  RestorationType RVar9;
  MB_MODE_INFO **ppMVar10;
  RestorationUnitInfo *pRVar11;
  FRAME_CONTEXT *pFVar12;
  byte bVar13;
  RestorationInfo *pRVar14;
  byte partition;
  int iVar15;
  int iVar16;
  short sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  uint mi_row_00;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int rcol0;
  ulong local_c8;
  MACROBLOCKD *local_c0;
  uint local_b8;
  int local_b4;
  ulong local_b0;
  long local_a8;
  int rrow1;
  int rrow0;
  int rcol1;
  RestorationInfo *local_90;
  long local_88;
  SgrprojInfo *local_80;
  WienerInfo *local_78;
  SgrprojInfo *local_70;
  WienerInfo *local_68;
  AV1Common *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_c8 = (ulong)(BLOCK_SIZE)mi_col;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_c8];
  bVar13 = bVar2 >> 1;
  iVar15 = (cpi->common).mi_params.mi_rows;
  partition = 0xff;
  mi_row_00 = (uint)tok_end;
  if (((int)mi_row_00 < iVar15) && (iVar8 = (cpi->common).mi_params.mi_cols, mi_row < iVar8)) {
    iVar16 = (cpi->common).mi_params.mi_stride;
    ppMVar10 = (cpi->common).mi_params.mi_grid_base;
    lVar24 = (long)(int)(iVar16 * mi_row_00 + mi_row);
    BVar3 = ppMVar10[lVar24]->bsize;
    if (BVar3 == (BLOCK_SIZE)mi_col) {
      partition = 0;
    }
    else {
      bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_c8]
      ;
      bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar3];
      bVar6 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar3];
      if ((BLOCK_8X8 < (BLOCK_SIZE)mi_col) && ((int)(bVar13 + mi_row_00) < iVar15)) {
        if ((int)((uint)(bVar4 >> 1) + mi_row) < iVar8) {
          if (bVar6 == bVar2) {
            partition = 8;
            if ((uint)bVar5 << 2 != (uint)bVar4) {
              partition = (ppMVar10[lVar24 + (int)((uint)(bVar4 >> 1) * iVar16)]->bsize != BVar3) *
                          '\x04' + 1;
            }
          }
          else if (bVar5 == bVar4) {
            partition = 9;
            if ((uint)bVar6 << 2 != (uint)bVar2) {
              partition = (ppMVar10[lVar24 + (ulong)bVar13]->bsize != BVar3) * '\x05' + 2;
            }
          }
          else {
            partition = 3;
            if (((uint)bVar5 * 2 == (uint)bVar4 && (uint)bVar6 * 2 == (uint)bVar2) &&
               (partition = 4,
               "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [ppMVar10[lVar24 + (int)((uint)(bVar4 >> 1) * iVar16)]->bsize] != bVar2)) {
              partition = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [ppMVar10[lVar24 + (ulong)bVar13]->bsize] == bVar4) * '\x03' + 3;
            }
          }
          goto LAB_00192612;
        }
      }
      partition = *(byte *)((long)&get_partition_base_partitions +
                           (ulong)(bVar5 < bVar4) + (ulong)(bVar6 < bVar2) * 2);
    }
  }
LAB_00192612:
  local_b0 = (ulong)partition;
  get_partition_subsize((BLOCK_SIZE)mi_col,partition);
  if (((int)mi_row_00 < iVar15) && (mi_row < (cpi->common).mi_params.mi_cols)) {
    local_60 = &cpi->common;
    local_b8 = (uint)(bVar2 >> 2);
    local_c0 = &(td->mb).e_mbd;
    local_90 = (cpi->common).rst_info;
    local_68 = (td->mb).e_mbd.wiener_info;
    local_70 = (td->mb).e_mbd.sgrproj_info;
    local_58 = (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    lVar24 = 0;
    while (lVar24 != local_58) {
      local_a8 = lVar24;
      if ((local_90[lVar24].frame_restoration_type != RESTORE_NONE) &&
         (iVar15 = av1_loop_restoration_corners_in_sb
                             (local_60,(int)lVar24,mi_row_00,mi_row,(BLOCK_SIZE)local_c8,&rcol0,
                              &rcol1,&rrow0,&rrow1), iVar15 != 0)) {
        pRVar1 = local_90 + lVar24;
        local_50 = (long)pRVar1->horz_units;
        lVar20 = (long)rrow0;
        pRVar14 = local_90 + lVar24;
        local_b4 = (uint)(local_a8 == 0) * 2 + 5;
        local_78 = local_68 + local_a8;
        local_80 = local_70 + local_a8;
        lVar18 = lVar20 * local_50 * 0x40;
        local_50 = local_50 << 6;
        lVar24 = lVar18 + 0x30;
        local_88 = lVar18 + 0x10;
        while (lVar20 < rrow1) {
          lVar26 = (long)rcol0;
          lVar23 = lVar26 * 0x40;
          lVar25 = lVar18 + lVar23;
          lVar19 = lVar24 + lVar23;
          lVar23 = lVar23 + local_88;
          local_48 = lVar24;
          local_40 = lVar18;
          local_38 = lVar20;
          for (; lVar26 < rcol1; lVar26 = lVar26 + 1) {
            pRVar11 = pRVar14->unit_info;
            RVar9 = pRVar1->frame_restoration_type;
            iVar15 = *(int *)((long)(pRVar11->wiener_info).vfilter + lVar25 + -0x10);
            if (RVar9 == RESTORE_WIENER) {
              aom_write_symbol(w,(uint)(iVar15 != 0),((td->mb).e_mbd.tile_ctx)->wiener_restore_cdf,2
                              );
              if (iVar15 != 0) {
LAB_0019291d:
                write_wiener_filter(local_b4,(WienerInfo *)
                                             ((long)(pRVar11->wiener_info).vfilter + lVar23 + -0x10)
                                    ,local_78,w);
              }
            }
            else if (RVar9 == RESTORE_SGRPROJ) {
              aom_write_symbol(w,(uint)(iVar15 != 0),((td->mb).e_mbd.tile_ctx)->sgrproj_restore_cdf,
                               2);
              if (iVar15 != 0) {
LAB_001928d6:
                write_sgrproj_filter
                          ((SgrprojInfo *)((long)(pRVar11->wiener_info).vfilter + lVar19 + -0x10),
                           local_80,w);
              }
            }
            else if (RVar9 == RESTORE_SWITCHABLE) {
              aom_write_symbol(w,iVar15,((td->mb).e_mbd.tile_ctx)->switchable_restore_cdf,3);
              if (iVar15 == 2) goto LAB_001928d6;
              if (iVar15 == 1) goto LAB_0019291d;
            }
            lVar25 = lVar25 + 0x40;
            lVar19 = lVar19 + 0x40;
            lVar23 = lVar23 + 0x40;
          }
          lVar18 = local_40 + local_50;
          lVar24 = local_48 + local_50;
          local_88 = local_88 + local_50;
          lVar20 = local_38 + 1;
        }
      }
      lVar24 = local_a8 + 1;
    }
    if (BLOCK_8X4 < (BLOCK_SIZE)mi_col) {
      iVar16 = bVar13 + mi_row_00;
      iVar15 = (cpi->common).mi_params.mi_rows;
      iVar8 = (cpi->common).mi_params.mi_cols;
      iVar21 = (uint)bVar13 + mi_row;
      lVar24 = (ulong)""[local_c8] - 1;
      if (iVar21 < iVar8 || iVar16 < iVar15) {
        lVar24 = (ulong)((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_row] >>
                                 ((uint)lVar24 & 0x1f) & 1) != 0) +
                        ((uint)(int)(td->mb).e_mbd.left_partition_context[mi_row_00 & 0x1f] >>
                         ((byte)lVar24 & 0x1f) & 1) * 2) + (ulong)""[local_c8] * 4;
        iVar22 = (int)lVar24 + -4;
        pFVar12 = (td->mb).e_mbd.tile_ctx;
        if (iVar16 < iVar15 && iVar21 < iVar8) {
          iVar15 = 4;
          if ((BLOCK_SIZE)mi_col != BLOCK_8X8) {
            iVar15 = ((BLOCK_SIZE)mi_col != BLOCK_128X128) + 8 +
                     (uint)((BLOCK_SIZE)mi_col != BLOCK_128X128);
          }
          aom_write_symbol(w,(int)local_b0,pFVar12->partition_cdf[lVar24 + -4],iVar15);
        }
        else {
          if (iVar16 < iVar15 || iVar8 <= iVar21) {
            sVar17 = ((pFVar12->partition_cdf[iVar22][1] - pFVar12->partition_cdf[iVar22][0] ^
                      0x8000) - pFVar12->partition_cdf[iVar22][2]) +
                     pFVar12->partition_cdf[iVar22][6];
            if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
              sVar17 = (sVar17 - pFVar12->partition_cdf[iVar22][7]) +
                       pFVar12->partition_cdf[iVar22][8];
            }
          }
          else {
            aVar7 = pFVar12->partition_cdf[iVar22][2];
            sVar17 = (((aVar7 - pFVar12->partition_cdf[iVar22][1]) +
                      pFVar12->partition_cdf[iVar22][4]) -
                     (aVar7 + pFVar12->partition_cdf[iVar22][5])) +
                     pFVar12->partition_cdf[iVar22][7] + -0x8000;
            if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
              sVar17 = (sVar17 - pFVar12->partition_cdf[iVar22][8]) +
                       pFVar12->partition_cdf[iVar22][9];
            }
          }
          rcol0 = (int)(ushort)(0x8000 - sVar17);
          od_ec_encode_cdf_q15(&w->ec,(uint)(partition == 3),(uint16_t *)&rcol0,2);
        }
      }
    }
    if (partition < 10) {
      (*(code *)(&DAT_0043bba0 + *(int *)(&DAT_0043bba0 + local_b0 * 4)))();
      return;
    }
    if ((BLOCK_8X4 < (BLOCK_SIZE)mi_col) &&
       (get_partition_subsize((BLOCK_SIZE)local_c8,'\x03'), partition < 10)) {
      (*(code *)(&DAT_0043bbc8 + *(int *)(&DAT_0043bbc8 + local_b0 * 4)))();
      return;
    }
  }
  return;
}

Assistant:

static inline void write_modes_sb(AV1_COMP *const cpi, ThreadData *const td,
                                  const TileInfo *const tile,
                                  aom_writer *const w, const TokenExtra **tok,
                                  const TokenExtra *const tok_end, int mi_row,
                                  int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

#if !CONFIG_REALTIME_ONLY
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    int rcol0, rcol1, rrow0, rrow1;

    // Skip some unnecessary work if loop restoration is disabled
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

    if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                           &rcol0, &rcol1, &rrow0, &rrow1)) {
      const int rstride = cm->rst_info[plane].horz_units;
      for (int rrow = rrow0; rrow < rrow1; ++rrow) {
        for (int rcol = rcol0; rcol < rcol1; ++rcol) {
          const int runit_idx = rcol + rrow * rstride;
          loop_restoration_write_sb_coeffs(cm, xd, runit_idx, w, plane,
                                           td->counts);
        }
      }
    }
  }
#endif

  write_partition(cm, xd, hbs, mi_row, mi_col, partition, bsize, w);
  switch (partition) {
    case PARTITION_NONE:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_row + hbs < mi_params->mi_rows)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_col + hbs < mi_params->mi_cols)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col, subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs,
                     subsize);
      break;
    case PARTITION_HORZ_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }

  // update partition context
  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}